

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

ull getbf(bitfield *bf,ull *a,ull *m,disctx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  iVar1 = bf->shr;
  lVar11 = 0;
  uVar4 = 0;
  iVar8 = iVar1;
  do {
    iVar2 = bf->sbf[lVar11].pos;
    iVar7 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar7 = iVar2;
    }
    iVar3 = bf->sbf[lVar11].len;
    uVar9 = ~(-1L << ((byte)iVar3 & 0x3f));
    bVar5 = (byte)(iVar2 % 0x40);
    uVar12 = uVar9 << (bVar5 & 0x3f);
    lVar10 = (long)(iVar7 >> 6);
    m[lVar10] = m[lVar10] | uVar12;
    uVar12 = (uVar12 & a[lVar10]) >> (bVar5 & 0x3f);
    if (0x40 < iVar2 % 0x40 + iVar3) {
      uVar9 = uVar9 >> (-bVar5 & 0x3f);
      m[lVar10 + 1] = m[lVar10 + 1] | uVar9;
      uVar12 = uVar12 | (uVar9 & a[lVar10 + 1]) << (-bVar5 & 0x3f);
    }
    uVar4 = uVar4 | uVar12 << ((byte)iVar8 & 0x3f);
    iVar8 = iVar8 + iVar3;
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  bVar5 = (byte)iVar8;
  switch(bf->mode) {
  case BF_SIGNED:
    bVar6 = bVar5 - 1;
    break;
  case BF_SLIGHTLY_SIGNED:
    if ((uVar4 >> ((ulong)(byte)(bVar5 - 1) & 0x3f) & 1) == 0) goto switchD_0016dfc8_default;
    bVar6 = bVar5 - 2;
    break;
  case BF_ULTRASIGNED:
    goto switchD_0016dfc8_caseD_3;
  case BF_LUT:
    uVar4 = bf->lut[uVar4];
  default:
    goto switchD_0016dfc8_default;
  }
  if ((uVar4 >> ((ulong)bVar6 & 0x3f) & 1) != 0) {
switchD_0016dfc8_caseD_3:
    uVar4 = uVar4 + (-1L << (bVar5 & 0x3f));
  }
switchD_0016dfc8_default:
  if (bf->pcrel != 0) {
    bVar5 = (byte)iVar1;
    uVar4 = uVar4 + (((ulong)ctx->pos + bf->pospreadd >> (bVar5 & 0x3f)) << (bVar5 & 0x3f));
  }
  return (uVar4 ^ bf->xorend) + bf->addend;
}

Assistant:

ull getbf(const struct bitfield *bf, ull *a, ull *m, struct disctx *ctx) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	if (bf->pcrel) {
		// <3 xtensa.
		res += (ctx->pos + bf->pospreadd) & -(1ull << bf->shr);
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}